

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_platform.cpp
# Opt level: O2

int sprintf_s(char *buffer,size_t sizeOfBuffer,char *format,...)

{
  char in_AL;
  int iVar1;
  int iVar2;
  undefined8 in_RCX;
  int iVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined8 local_e8;
  void **local_e0;
  undefined1 *local_d8;
  undefined1 local_c8 [24];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  if (sizeOfBuffer == 0) {
    iVar2 = 0;
  }
  else {
    local_d8 = local_c8;
    local_e0 = &args[0].overflow_arg_area;
    local_e8 = 0x3000000018;
    local_b0 = in_RCX;
    local_a8 = in_R8;
    local_a0 = in_R9;
    iVar1 = vsnprintf(buffer,sizeOfBuffer,format,&local_e8);
    buffer[sizeOfBuffer - 1] = '\0';
    iVar3 = (int)sizeOfBuffer + -1;
    if (iVar1 < iVar3) {
      iVar3 = iVar1;
    }
    iVar2 = (int)sizeOfBuffer + -1;
    if (-1 < iVar1) {
      iVar2 = iVar3;
    }
  }
  return iVar2;
}

Assistant:

int sprintf_s(char *buffer, size_t sizeOfBuffer, const char *format, ...)
{
   if (!sizeOfBuffer)
      return 0;

   va_list args;
   va_start(args, format);
   int c = vsnprintf(buffer, sizeOfBuffer, format, args);
   va_end(args);

   buffer[sizeOfBuffer - 1] = '\0';

   if (c < 0)
      return static_cast<int>(sizeOfBuffer - 1);

   return LZHAM_MIN(c, (int)sizeOfBuffer - 1);
}